

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O0

HalfCycles __thiscall
MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::perform_machine_cycle
          (ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true> *this,
          PartialMachineCycle *cycle)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  uint8_t uVar4;
  ushort uVar5;
  int iVar6;
  pointer pTVar7;
  HalfCycles offset;
  pointer pFVar8;
  pointer pMVar9;
  uint8_t *puVar10;
  ssize_t sVar11;
  ulong uVar12;
  uint8_t *puVar13;
  ulong uVar14;
  IntType IVar15;
  uint *puVar16;
  void *__buf;
  void *__buf_00;
  uint local_17c;
  Cycles local_150;
  undefined8 local_148;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  undefined8 local_130;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  undefined8 local_120;
  int local_114;
  ulong uStack_110;
  int next_write_address;
  size_t characters_written;
  int write_address;
  int read_address;
  int buffer_size;
  int buffer_start;
  HalfCycles local_e8;
  undefined1 local_e0 [16];
  undefined1 local_d0 [28];
  int port;
  undefined1 local_b0 [16];
  undefined1 local_a0 [36];
  int slot_hit_1;
  uint local_74;
  int local_70;
  int slot_hit;
  int next_byte;
  FileSpeed tape_speed;
  unique_ptr<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
  new_speed;
  uint16_t address;
  undefined1 local_40 [32];
  HalfCycles total_length;
  PartialMachineCycle *cycle_local;
  ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true> *this_local;
  HalfCycles addition;
  
  iVar6 = 0;
  if (cycle->operation == ReadOpcode) {
    iVar6 = 2;
  }
  total_length.super_WrappedInt<HalfCycles>.length_ =
       (WrappedInt<HalfCycles>)(WrappedInt<HalfCycles>)cycle;
  HalfCycles::HalfCycles((HalfCycles *)&this_local,(long)iVar6);
  local_40._16_8_ =
       WrappedInt<HalfCycles>::operator+
                 ((WrappedInt<HalfCycles> *)&this_local,
                  (HalfCycles *)((long)total_length.super_WrappedInt<HalfCycles>.length_ + 8));
  local_40._24_8_ = local_40._16_8_;
  bVar2 = JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator+=
                    (&this->vdp_,(HalfCycles)local_40._16_8_);
  if (bVar2) {
    JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
              ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
               local_40);
    pTVar7 = std::
             unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
             ::operator->((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                           *)local_40);
    bVar2 = TI::TMS::TMS9918<(TI::TMS::Personality)0>::get_interrupt_line(pTVar7);
    offset = JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::
             last_sequence_point_overrun(&this->vdp_);
    CPU::Z80::ProcessorBase::set_interrupt_line(&(this->z80_).super_ProcessorBase,bVar2,offset);
    std::
    unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                   *)local_40);
  }
  WrappedInt<HalfCycles>::operator+=
            (&(this->time_since_ay_update_).super_WrappedInt<HalfCycles>,
             (HalfCycles *)(local_40 + 0x18));
  WrappedInt<HalfCycles>::operator+=
            (&this->memory_slots_[0].cycles_since_update.super_WrappedInt<HalfCycles>,
             (HalfCycles *)(local_40 + 0x18));
  WrappedInt<HalfCycles>::operator+=
            (&this->memory_slots_[1].cycles_since_update.super_WrappedInt<HalfCycles>,
             (HalfCycles *)(local_40 + 0x18));
  WrappedInt<HalfCycles>::operator+=
            (&this->memory_slots_[2].cycles_since_update.super_WrappedInt<HalfCycles>,
             (HalfCycles *)(local_40 + 0x18));
  WrappedInt<HalfCycles>::operator+=
            (&this->memory_slots_[3].cycles_since_update.super_WrappedInt<HalfCycles>,
             (HalfCycles *)(local_40 + 0x18));
  bVar2 = CPU::Z80::PartialMachineCycle::is_terminal
                    ((PartialMachineCycle *)total_length.super_WrappedInt<HalfCycles>.length_);
  if (bVar2) {
    if (*(long *)((long)total_length.super_WrappedInt<HalfCycles>.length_ + 0x10) == 0) {
      local_17c = 0;
    }
    else {
      local_17c = (uint)**(ushort **)
                          ((long)total_length.super_WrappedInt<HalfCycles>.length_ + 0x10);
    }
    uVar5 = (ushort)local_17c;
    if (*(uint *)total_length.super_WrappedInt<HalfCycles>.length_ < 6) {
      iVar6 = (int)local_17c >> 0xd;
      switch(*(uint *)total_length.super_WrappedInt<HalfCycles>.length_) {
      case 0:
        if ((this->use_fast_tape_ & 1U) != 0) {
          if (uVar5 == 0x1a63) {
            Intel::i8255::
            i8255<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler>
            ::write(&this->i8255_,0xab,(void *)0x8,0xa543f0);
            CPU::Z80::ProcessorBase::set_value_of(&(this->z80_).super_ProcessorBase,IFF1,0);
            CPU::Z80::ProcessorBase::set_value_of(&(this->z80_).super_ProcessorBase,IFF2,0);
            Storage::Tape::MSX::Parser::find_header((Parser *)&next_byte,&this->tape_player_);
            bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&next_byte);
            if (bVar2) {
              pFVar8 = std::
                       unique_ptr<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
                       ::operator->((unique_ptr<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
                                     *)&next_byte);
              uVar4 = pFVar8->minimum_start_bit_duration;
              puVar13 = ram(this);
              puVar13[0xfca4] = uVar4;
              pFVar8 = std::
                       unique_ptr<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
                       ::operator->((unique_ptr<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
                                     *)&next_byte);
              uVar4 = pFVar8->low_high_disrimination_duration;
              puVar13 = ram(this);
              puVar13[0xfca5] = uVar4;
              CPU::Z80::ProcessorBase::set_value_of(&(this->z80_).super_ProcessorBase,Flags,0);
            }
            else {
              CPU::Z80::ProcessorBase::set_value_of(&(this->z80_).super_ProcessorBase,Flags,1);
            }
            **(undefined1 **)((long)total_length.super_WrappedInt<HalfCycles>.length_ + 0x18) = 0xc9
            ;
            std::
            unique_ptr<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
            ::~unique_ptr((unique_ptr<Storage::Tape::MSX::Parser::FileSpeed,_std::default_delete<Storage::Tape::MSX::Parser::FileSpeed>_>
                           *)&next_byte);
            break;
          }
          if (uVar5 == 0x1abc) {
            puVar13 = ram(this);
            slot_hit._2_1_ = puVar13[0xfca4];
            puVar13 = ram(this);
            slot_hit._3_1_ = puVar13[0xfca5];
            local_70 = Storage::Tape::MSX::Parser::get_byte
                                 ((FileSpeed *)((long)&slot_hit + 2),&this->tape_player_);
            if (local_70 < 0) {
              CPU::Z80::ProcessorBase::set_value_of(&(this->z80_).super_ProcessorBase,Flags,1);
            }
            else {
              CPU::Z80::ProcessorBase::set_value_of
                        (&(this->z80_).super_ProcessorBase,A,(uint16_t)local_70);
              CPU::Z80::ProcessorBase::set_value_of(&(this->z80_).super_ProcessorBase,Flags,0);
            }
            **(undefined1 **)((long)total_length.super_WrappedInt<HalfCycles>.length_ + 0x18) = 0xc9
            ;
            break;
          }
        }
        if (uVar5 == 0) {
          this->pc_zero_accesses_ = this->pc_zero_accesses_ + 1;
        }
        this->pc_address_ = uVar5;
      case 1:
        if ((uVar5 == 0xffff) &&
           (((this->final_slot_->super_PrimarySlot).supports_secondary_paging & 1U) != 0)) {
          bVar3 = PrimarySlot::secondary_paging(&this->final_slot_->super_PrimarySlot);
          **(byte **)((long)total_length.super_WrappedInt<HalfCycles>.length_ + 0x18) = bVar3 ^ 0xff
          ;
        }
        else if (this->read_pointers_[iVar6] == (uint8_t *)0x0) {
          local_74 = (int)(uint)this->primary_slots_ >> (sbyte)(((int)local_17c >> 0xe) << 1) & 3;
          pMVar9 = std::
                   unique_ptr<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>
                   ::operator->(&this->memory_slots_[(int)local_74].handler);
          register0x00000000 =
               (IntType)WrappedInt<HalfCycles>::flush<HalfCycles>
                                  (&this->memory_slots_[(int)local_74].cycles_since_update.
                                    super_WrappedInt<HalfCycles>);
          (*pMVar9->_vptr_MemorySlotHandler[2])(pMVar9,register0x00000000);
          pMVar9 = std::
                   unique_ptr<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>
                   ::operator->(&this->memory_slots_[(int)local_74].handler);
          iVar6 = (*pMVar9->_vptr_MemorySlotHandler[4])(pMVar9,(ulong)uVar5);
          **(undefined1 **)((long)total_length.super_WrappedInt<HalfCycles>.length_ + 0x18) =
               (char)iVar6;
        }
        else {
          **(uint8_t **)((long)total_length.super_WrappedInt<HalfCycles>.length_ + 0x18) =
               this->read_pointers_[iVar6][(int)(local_17c & 0x1fff)];
        }
        break;
      case 2:
        if ((uVar5 == 0xffff) &&
           (((this->final_slot_->super_PrimarySlot).supports_secondary_paging & 1U) != 0)) {
          PrimarySlot::set_secondary_paging
                    (&this->final_slot_->super_PrimarySlot,
                     **(uint8_t **)((long)total_length.super_WrappedInt<HalfCycles>.length_ + 0x18))
          ;
          update_paging(this);
        }
        else {
          local_a0._28_4_ =
               (int)(uint)this->primary_slots_ >> (sbyte)(((int)local_17c >> 0xe) << 1) & 3;
          bVar2 = std::unique_ptr::operator_cast_to_bool
                            ((unique_ptr *)&this->memory_slots_[(int)local_a0._28_4_].handler);
          if (bVar2) {
            update_audio(this);
            pMVar9 = std::
                     unique_ptr<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>
                     ::operator->(&this->memory_slots_[(int)local_a0._28_4_].handler);
            local_a0._16_8_ =
                 WrappedInt<HalfCycles>::flush<HalfCycles>
                           (&this->memory_slots_[(int)local_a0._28_4_].cycles_since_update.
                             super_WrappedInt<HalfCycles>);
            (*pMVar9->_vptr_MemorySlotHandler[2])(pMVar9,local_a0._16_8_);
            pMVar9 = std::
                     unique_ptr<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>
                     ::operator->(&this->memory_slots_[(int)local_a0._28_4_].handler);
            bVar3 = **(byte **)((long)total_length.super_WrappedInt<HalfCycles>.length_ + 0x18);
            puVar13 = this->read_pointers_[(int)(uint)this->pc_address_ >> 0xd];
            puVar10 = PrimarySlot::read_pointer
                                (&this->memory_slots_[0].super_PrimarySlot,
                                 (int)(uint)this->pc_address_ >> 0xd);
            (*pMVar9->_vptr_MemorySlotHandler[3])
                      (pMVar9,(ulong)uVar5,(ulong)bVar3,(ulong)(puVar13 != puVar10));
          }
          else {
            this->write_pointers_[iVar6][(int)(local_17c & 0x1fff)] =
                 **(uint8_t **)((long)total_length.super_WrappedInt<HalfCycles>.length_ + 0x18);
          }
        }
        break;
      case 3:
        puVar16 = &switchD_0075e982::switchdataD_00a54618;
        switch(local_17c & 0xff) {
        case 0x98:
        case 0x99:
          JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
                    ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *
                     )local_a0);
          pTVar7 = std::
                   unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                   ::operator->((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                                 *)local_a0);
          sVar11 = TI::TMS::TMS9918<(TI::TMS::Personality)0>::read
                             (pTVar7,local_17c,__buf_00,(size_t)puVar16);
          **(undefined1 **)((long)total_length.super_WrappedInt<HalfCycles>.length_ + 0x18) =
               (char)sVar11;
          std::
          unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
          ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                         *)local_a0);
          JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
                    ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *
                     )local_b0);
          pTVar7 = std::
                   unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                   ::operator->((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                                 *)local_b0);
          bVar2 = TI::TMS::TMS9918<(TI::TMS::Personality)0>::get_interrupt_line(pTVar7);
          HalfCycles::HalfCycles((HalfCycles *)(local_d0 + 0x18),0);
          CPU::Z80::ProcessorBase::set_interrupt_line
                    (&(this->z80_).super_ProcessorBase,bVar2,(HalfCycles)stack0xffffffffffffff48);
          std::
          unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
          ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                         *)local_b0);
          break;
        case 0x9a:
        case 0x9b:
          break;
        case 0xa2:
          update_audio(this);
          uVar4 = GI::AY38910::Utility::read<GI::AY38910::AY38910<false>>(&(this->speaker_).ay);
          **(uint8_t **)((long)total_length.super_WrappedInt<HalfCycles>.length_ + 0x18) = uVar4;
          break;
        case 0xa8:
        case 0xa9:
        case 0xaa:
        case 0xab:
          sVar11 = Intel::i8255::
                   i8255<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler>
                   ::read(&this->i8255_,local_17c,__buf,0xa54618);
          **(undefined1 **)((long)total_length.super_WrappedInt<HalfCycles>.length_ + 0x18) =
               (char)sVar11;
          break;
        case 0xb5:
          break;
        case 0xfc:
        case 0xfd:
        case 0xfe:
        case 0xff:
        default:
          **(undefined1 **)((long)total_length.super_WrappedInt<HalfCycles>.length_ + 0x18) = 0xff;
        }
        break;
      case 4:
        local_d0._20_4_ = local_17c & 0xff;
        puVar16 = &switchD_0075eb58::switchdataD_00a54408;
        switch(local_d0._20_4_) {
        case 0x7c:
        case 0x7d:
          Yamaha::OPL::OPLBase<Yamaha::OPL::OPLL,_false>::write
                    (&(this->speaker_).opll.super_OPLBase<Yamaha::OPL::OPLL,_false>,local_17c,
                     (void *)(ulong)**(byte **)((long)total_length.super_WrappedInt<HalfCycles>.
                                                      length_ + 0x18),CONCAT62(0xa5,uVar5));
          break;
        default:
          printf("Unhandled write %02x of %02x\n",(ulong)(local_17c & 0xff),
                 (ulong)**(byte **)((long)total_length.super_WrappedInt<HalfCycles>.length_ + 0x18))
          ;
          break;
        case 0x98:
        case 0x99:
          JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
                    ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *
                     )local_d0);
          pTVar7 = std::
                   unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                   ::operator->((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                                 *)local_d0);
          TI::TMS::TMS9918<(TI::TMS::Personality)0>::write
                    (pTVar7,local_17c,
                     (void *)(ulong)**(byte **)((long)total_length.super_WrappedInt<HalfCycles>.
                                                      length_ + 0x18),(size_t)puVar16);
          std::
          unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
          ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                         *)local_d0);
          JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
                    ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *
                     )local_e0);
          pTVar7 = std::
                   unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                   ::operator->((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                                 *)local_e0);
          bVar2 = TI::TMS::TMS9918<(TI::TMS::Personality)0>::get_interrupt_line(pTVar7);
          HalfCycles::HalfCycles(&local_e8,0);
          CPU::Z80::ProcessorBase::set_interrupt_line
                    (&(this->z80_).super_ProcessorBase,bVar2,local_e8);
          std::
          unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
          ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                         *)local_e0);
          break;
        case 0x9a:
        case 0x9b:
          break;
        case 0xa0:
        case 0xa1:
          update_audio(this);
          GI::AY38910::Utility::write<GI::AY38910::AY38910<false>>
                    (&(this->speaker_).ay,local_d0._20_4_ == 0xa1,
                     **(uint8_t **)((long)total_length.super_WrappedInt<HalfCycles>.length_ + 0x18))
          ;
          break;
        case 0xa8:
        case 0xa9:
        case 0xaa:
        case 0xab:
          Intel::i8255::
          i8255<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler>
          ::write(&this->i8255_,local_17c,
                  (void *)(ulong)**(byte **)((long)total_length.super_WrappedInt<HalfCycles>.length_
                                            + 0x18),0xa54408);
          break;
        case 0xb4:
          break;
        case 0xb5:
          break;
        case 0xfc:
        case 0xfd:
        case 0xfe:
        case 0xff:
        }
        break;
      case 5:
        **(undefined1 **)((long)total_length.super_WrappedInt<HalfCycles>.length_ + 0x18) = 0xff;
        uVar12 = std::__cxx11::string::empty();
        if ((uVar12 & 1) == 0) {
          read_address = 0xfbf0;
          write_address = 0x28;
          puVar13 = ram(this);
          uVar4 = puVar13[0xf3fa];
          puVar13 = ram(this);
          characters_written._4_4_ = (uint)CONCAT11(puVar13[0xf3fb],uVar4);
          puVar13 = ram(this);
          uVar4 = puVar13[0xf3f8];
          puVar13 = ram(this);
          uStack_110 = 0;
          characters_written._0_4_ = CONCAT11(puVar13[0xf3f9],uVar4) - 0xfbf0;
          characters_written._4_4_ = characters_written._4_4_ - 0xfbf0;
          while ((uVar12 = uStack_110, uVar14 = std::__cxx11::string::size(), uVar12 < uVar14 &&
                 (local_114 = ((int)characters_written + 1) % 0x28,
                 local_114 != characters_written._4_4_))) {
            puVar13 = (uint8_t *)std::__cxx11::string::operator[]((ulong)&this->input_text_);
            uVar4 = *puVar13;
            puVar13 = ram(this);
            puVar13[(int)characters_written + 0xfbf0] = uVar4;
            uStack_110 = uStack_110 + 1;
            characters_written._0_4_ = local_114;
          }
          local_128._M_current = (char *)std::__cxx11::string::begin();
          __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                    ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_120,&local_128);
          local_140._M_current = (char *)std::__cxx11::string::begin();
          local_138 = __gnu_cxx::
                      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator+(&local_140,uStack_110);
          __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                    ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_130,&local_138);
          local_148 = std::__cxx11::string::erase(&this->input_text_,local_120,local_130);
          characters_written._0_4_ = (int)characters_written + 0xfbf0;
          uVar4 = (uint8_t)(int)characters_written;
          puVar13 = ram(this);
          puVar13[0xf3f8] = uVar4;
          uVar1 = (uint)(int)characters_written >> 8;
          puVar13 = ram(this);
          puVar13[0xf3f9] = (uint8_t)uVar1;
        }
      }
    }
  }
  if ((this->tape_player_is_sleeping_ & 1U) == 0) {
    IVar15 = WrappedInt<HalfCycles>::as_integral
                       ((WrappedInt<HalfCycles> *)
                        ((long)total_length.super_WrappedInt<HalfCycles>.length_ + 8));
    Cycles::Cycles(&local_150,(long)(int)IVar15);
    Storage::Tape::BinaryTapePlayer::run_for(&this->tape_player_,local_150);
  }
  return (HalfCycles)(WrappedInt<HalfCycles>)this_local;
}

Assistant:

forceinline HalfCycles perform_machine_cycle(const CPU::Z80::PartialMachineCycle &cycle) {
			// Per the best information I currently have, the MSX inserts an extra cycle into each opcode read,
			// but otherwise runs without pause.
			const HalfCycles addition((cycle.operation == CPU::Z80::PartialMachineCycle::ReadOpcode) ? 2 : 0);
			const HalfCycles total_length = addition + cycle.length;
			if(vdp_ += total_length) {
				z80_.set_interrupt_line(vdp_->get_interrupt_line(), vdp_.last_sequence_point_overrun());
			}
			time_since_ay_update_ += total_length;
			memory_slots_[0].cycles_since_update += total_length;
			memory_slots_[1].cycles_since_update += total_length;
			memory_slots_[2].cycles_since_update += total_length;
			memory_slots_[3].cycles_since_update += total_length;

			if constexpr (model >= Target::Model::MSX2) {
				clock_.run_for(total_length);
			}

			if(cycle.is_terminal()) {
				uint16_t address = cycle.address ? *cycle.address : 0x0000;
				switch(cycle.operation) {
					case CPU::Z80::PartialMachineCycle::ReadOpcode:
						if(use_fast_tape_) {
							if(address == 0x1a63) {
								// TAPION

								// Enable the tape motor.
								i8255_.write(0xab, 0x8);

								// Disable interrupts.
								z80_.set_value_of(CPU::Z80::Register::IFF1, 0);
								z80_.set_value_of(CPU::Z80::Register::IFF2, 0);

								// Use the parser to find a header, and if one is found then populate
								// LOWLIM and WINWID, and reset carry. Otherwise set carry.
								using Parser = Storage::Tape::MSX::Parser;
								std::unique_ptr<Parser::FileSpeed> new_speed = Parser::find_header(tape_player_);
								if(new_speed) {
									ram()[0xfca4] = new_speed->minimum_start_bit_duration;
									ram()[0xfca5] = new_speed->low_high_disrimination_duration;
									z80_.set_value_of(CPU::Z80::Register::Flags, 0);
								} else {
									z80_.set_value_of(CPU::Z80::Register::Flags, 1);
								}

								// RET.
								*cycle.value = 0xc9;
								break;
							}

							if(address == 0x1abc) {
								// TAPIN

								// Grab the current values of LOWLIM and WINWID.
								using Parser = Storage::Tape::MSX::Parser;
								Parser::FileSpeed tape_speed;
								tape_speed.minimum_start_bit_duration = ram()[0xfca4];
								tape_speed.low_high_disrimination_duration = ram()[0xfca5];

								// Ask the tape parser to grab a byte.
								int next_byte = Parser::get_byte(tape_speed, tape_player_);

								// If a byte was found, return it with carry unset. Otherwise set carry to
								// indicate error.
								if(next_byte >= 0) {
									z80_.set_value_of(CPU::Z80::Register::A, uint16_t(next_byte));
									z80_.set_value_of(CPU::Z80::Register::Flags, 0);
								} else {
									z80_.set_value_of(CPU::Z80::Register::Flags, 1);
								}

								// RET.
								*cycle.value = 0xc9;
								break;
							}
						}

						if(!address) {
							pc_zero_accesses_++;
						}

						// TODO: below relates to confidence measurements. Reinstate, somehow.
//						if(is_unpopulated_[address >> 13] == unpopulated_) {
//							performed_unmapped_access_ = true;
//						}

						pc_address_ = address;	// This is retained so as to be able to name the source of an access to cartridge handlers.
						[[fallthrough]];

					case CPU::Z80::PartialMachineCycle::Read:
						if(address == 0xffff && final_slot_->supports_secondary_paging) {
							*cycle.value = final_slot_->secondary_paging() ^ 0xff;
							break;
						}

						if(read_pointers_[address >> 13]) {
							*cycle.value = read_pointers_[address >> 13][address & 8191];
						} else {
							const int slot_hit = (primary_slots_ >> ((address >> 14) * 2)) & 3;
							memory_slots_[slot_hit].handler->run_for(memory_slots_[slot_hit].cycles_since_update.template flush<HalfCycles>());
							*cycle.value = memory_slots_[slot_hit].handler->read(address);
						}
					break;

					case CPU::Z80::PartialMachineCycle::Write: {
						if(address == 0xffff && final_slot_->supports_secondary_paging) {
							final_slot_->set_secondary_paging(*cycle.value);
							update_paging();
							break;
						}

						const int slot_hit = (primary_slots_ >> ((address >> 14) * 2)) & 3;
						if(memory_slots_[slot_hit].handler) {
							update_audio();
							memory_slots_[slot_hit].handler->run_for(memory_slots_[slot_hit].cycles_since_update.template flush<HalfCycles>());
							memory_slots_[slot_hit].handler->write(
								address,
								*cycle.value,
								read_pointers_[pc_address_ >> 13] != memory_slots_[0].read_pointer(pc_address_ >> 13));
						} else {
							write_pointers_[address >> 13][address & 8191] = *cycle.value;
						}
					} break;

					case CPU::Z80::PartialMachineCycle::Input:
						switch(address & 0xff) {
							case 0x9a:	case 0x9b:
								if constexpr (vdp_model() == TI::TMS::TMS9918A) {
									break;
								}
								[[fallthrough]];
							case 0x98:	case 0x99:
								*cycle.value = vdp_->read(address);
								z80_.set_interrupt_line(vdp_->get_interrupt_line());
							break;

							case 0xa2:
								update_audio();
								*cycle.value = GI::AY38910::Utility::read(speaker_.ay);
							break;

							case 0xa8:	case 0xa9:
							case 0xaa:	case 0xab:
								*cycle.value = i8255_.read(address);
							break;

							case 0xb5:
								if constexpr (model == Target::Model::MSX1) {
									break;
								}
								*cycle.value = clock_.read(next_clock_register_);
							break;

							case 0xfc: case 0xfd: case 0xfe: case 0xff:
								if constexpr (model != Target::Model::MSX1) {
									*cycle.value = ram_mapper_[(address & 0xff) - 0xfc];
									break;
								}
								[[fallthrough]];

							default:
//								printf("Unhandled read %02x\n", address & 0xff);
								*cycle.value = 0xff;
							break;
						}
					break;

					case CPU::Z80::PartialMachineCycle::Output: {
						const int port = address & 0xff;
						switch(port) {
							case 0x9a:	case 0x9b:
								if constexpr (vdp_model() == TI::TMS::TMS9918A) {
									break;
								}
								[[fallthrough]];
							case 0x98:	case 0x99:
								vdp_->write(address, *cycle.value);
								z80_.set_interrupt_line(vdp_->get_interrupt_line());
							break;

							case 0xa0:	case 0xa1:
								update_audio();
								GI::AY38910::Utility::write(speaker_.ay, port == 0xa1, *cycle.value);
							break;

							case 0xa8:	case 0xa9:
							case 0xaa:	case 0xab:
								i8255_.write(address, *cycle.value);
							break;

							case 0xb4:
								if constexpr (model == Target::Model::MSX1) {
									break;
								}
								next_clock_register_ = *cycle.value;
							break;
							case 0xb5:
								if constexpr (model == Target::Model::MSX1) {
									break;
								}
								clock_.write(next_clock_register_, *cycle.value);
							break;

							case 0xfc: case 0xfd: case 0xfe: case 0xff: {
								if constexpr (model == Target::Model::MSX1) {
									break;
								}

								ram_mapper_[port - 0xfc] = *cycle.value;

								// Apply to RAM.
								//
								// On a real MSX this may also affect other slots.
								// I've not yet needed it to propagate further, so
								// have not implemented any onward route.
								const uint16_t region = uint16_t((port - 0xfc) << 14);
								const size_t base = size_t(*cycle.value) << 14;
								if(base < RAMSize) {
									ram_slot().template map<MemorySlot::AccessType::ReadWrite>(base, region, 0x4000);
								} else {
									ram_slot().unmap(region, 0x4000);
								}

								update_paging();
							} break;

							case 0x7c:	case 0x7d:
								if constexpr (has_opll) {
									speaker_.opll.write(address, *cycle.value);
									break;
								}
								[[fallthrough]];

							default:
								printf("Unhandled write %02x of %02x\n", address & 0xff, *cycle.value);
							break;
						}
					} break;

					case CPU::Z80::PartialMachineCycle::Interrupt:
						*cycle.value = 0xff;

						// Take this as a convenient moment to jump into the keyboard buffer, if desired.
						if(!input_text_.empty()) {
							// The following are KEYBUF per the Red Book; its address and its definition as DEFS 40.
							const int buffer_start = 0xfbf0;
							const int buffer_size = 40;

							// Also from the Red Book: GETPNT is at F3FAH and PUTPNT is at F3F8H.
							int read_address = ram()[0xf3fa] | (ram()[0xf3fb] << 8);
							int write_address = ram()[0xf3f8] | (ram()[0xf3f9] << 8);

							// Write until either the string is exhausted or the write_pointer is immediately
							// behind the read pointer; temporarily map write_address and read_address into
							// buffer-relative values.
							std::size_t characters_written = 0;
							write_address -= buffer_start;
							read_address -= buffer_start;
							while(characters_written < input_text_.size()) {
								const int next_write_address = (write_address + 1) % buffer_size;
								if(next_write_address == read_address) break;
								ram()[write_address + buffer_start] = uint8_t(input_text_[characters_written]);
								++characters_written;
								write_address = next_write_address;
							}
							input_text_.erase(input_text_.begin(), input_text_.begin() + std::string::difference_type(characters_written));

							// Map the write address back into absolute terms and write it out again as PUTPNT.
							write_address += buffer_start;
							ram()[0xf3f8] = uint8_t(write_address);
							ram()[0xf3f9] = uint8_t(write_address >> 8);
						}
					break;

					default: break;
				}
			}

			if(!tape_player_is_sleeping_)
				tape_player_.run_for(int(cycle.length.as_integral()));

			return addition;
		}